

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>
fmt::v8::detail::
write_int_noinline<char16_t,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,unsigned__int128>
          (back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> out,
          write_int_arg<unsigned___int128> arg,basic_format_specs<char16_t> *specs,locale_ref loc)

{
  undefined1 value [16];
  undefined1 n [16];
  undefined1 n_00 [16];
  undefined1 n_01 [16];
  undefined1 n_02 [16];
  uint uVar1;
  char16_t value_00;
  detail *pdVar2;
  back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> bVar3;
  int iVar4;
  type tVar5;
  back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> *pbVar6;
  back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> bVar7;
  bool bVar8;
  undefined1 in_stack_fffffffffffffa88 [12];
  undefined1 in_stack_fffffffffffffa94;
  char in_stack_fffffffffffffa95;
  undefined1 in_stack_fffffffffffffa96;
  char in_stack_fffffffffffffa97;
  basic_format_specs<char16_t> *specs_local;
  locale_ref loc_local;
  back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> out_local;
  uint local_4f8;
  undefined4 uStack_4c4;
  int num_digits_3;
  undefined4 uStack_474;
  int num_digits_2;
  bool upper_1;
  undefined4 uStack_424;
  int num_digits_1;
  bool upper;
  undefined4 uStack_3d4;
  int num_digits;
  uint local_37c;
  char16_t cStack_378;
  uint prefix;
  unsigned___int128 abs_value;
  void *local_360;
  buffer<char16_t> *local_358;
  buffer<char16_t> *local_350;
  detail *local_348;
  long local_340;
  int local_338;
  undefined1 local_328 [40];
  long local_300;
  int local_2f8;
  buffer<char16_t> *local_2e0;
  undefined1 local_2d8 [8];
  write_int_data<char16_t> data;
  back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> local_2b0;
  value_type_conflict3 local_2a6;
  uint local_2a4;
  back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> bStack_2a0;
  uint p;
  back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> it;
  back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> local_288;
  buffer<char16_t> *local_280;
  detail *local_278;
  long local_270;
  int local_268;
  bool bStack_264;
  undefined1 local_258 [40];
  long local_230;
  int local_228;
  bool local_224;
  buffer<char16_t> *local_210;
  undefined1 local_208 [8];
  write_int_data<char16_t> data_1;
  back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> local_1e0;
  value_type_conflict3 local_1d6;
  uint local_1d4;
  back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> bStack_1d0;
  uint p_1;
  back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> it_1;
  back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> local_1b8;
  buffer<char16_t> *local_1b0;
  detail *local_1a8;
  long local_1a0;
  int local_198;
  undefined1 local_188 [40];
  long local_160;
  int local_158;
  buffer<char16_t> *local_140;
  undefined1 local_138 [8];
  write_int_data<char16_t> data_2;
  back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> local_110;
  value_type_conflict3 local_106;
  uint local_104;
  back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> bStack_100;
  uint p_2;
  back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> it_2;
  back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> local_e8;
  buffer<char16_t> *local_e0;
  detail *local_d8;
  long local_d0;
  int local_c8;
  undefined1 local_b8 [40];
  long local_90;
  int local_88;
  buffer<char16_t> *local_70;
  undefined1 local_68 [8];
  write_int_data<char16_t> data_3;
  back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> local_40;
  value_type_conflict3 local_36;
  uint local_34;
  back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> bStack_30;
  uint p_3;
  back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> it_3;
  back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> local_18;
  buffer<char16_t> *local_10;
  
  abs_value._0_8_ = arg.abs_value._8_8_;
  _cStack_378 = (detail *)arg.abs_value;
  pdVar2 = _cStack_378;
  local_4f8 = arg.prefix;
  local_37c = local_4f8;
  abs_value._8_8_ = (buffer<char16_t> *)specs;
  local_360 = loc.locale_;
  local_358 = out.container;
  switch(specs->type) {
  case none:
  case dec:
    if (((*(ushort *)&specs->field_0x9 >> 8 & 1) == 0) ||
       (value[0xc] = in_stack_fffffffffffffa94, value._0_12_ = in_stack_fffffffffffffa88,
       value[0xd] = in_stack_fffffffffffffa95, value[0xe] = in_stack_fffffffffffffa96,
       value[0xf] = in_stack_fffffffffffffa97,
       bVar8 = write_int_localized<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,unsigned__int128,char16_t>
                         ((detail *)&local_358,
                          (back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> *)
                          (detail *)arg.abs_value,(unsigned___int128)value,arg.abs_value._8_4_,
                          (basic_format_specs<char16_t> *)(arg._16_8_ & 0xffffffff),
                          (locale_ref)specs), !bVar8)) {
      n[0xc] = in_stack_fffffffffffffa94;
      n._0_12_ = in_stack_fffffffffffffa88;
      n[0xd] = in_stack_fffffffffffffa95;
      n[0xe] = in_stack_fffffffffffffa96;
      n[0xf] = in_stack_fffffffffffffa97;
      iVar4 = count_digits(_cStack_378,(uint128_t)n);
      uVar1 = local_37c;
      local_348 = _cStack_378;
      local_340 = (long)abs_value;
      unique0x1000062f = uStack_3d4;
      local_338 = iVar4;
      local_288.container = local_358;
      it.container = abs_value._8_8_;
      if (*(int *)&(abs_value._8_8_)->_vptr_buffer == 0 &&
          *(int *)((long)&(abs_value._8_8_)->_vptr_buffer + 4) == -1) {
        tVar5 = to_unsigned<int>(iVar4);
        pbVar6 = reserve<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>>
                           (&local_288,(ulong)(tVar5 + (uVar1 >> 0x18)));
        bStack_2a0.container = pbVar6->container;
        if (uVar1 != 0) {
          for (local_2a4 = uVar1 & 0xffffff; local_2a4 != 0; local_2a4 = local_2a4 >> 8) {
            local_2a6 = (ushort)local_2a4 & 0xff;
            local_2b0 = std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>::operator++
                                  (&stack0xfffffffffffffd60,0);
            pbVar6 = std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>::operator*
                               (&local_2b0);
            std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>::operator=
                      (pbVar6,&local_2a6);
          }
        }
        bVar3.container = local_288.container;
        data.padding = (size_t)bStack_2a0.container;
        bVar7 = write_int<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>,_char16_t,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/format.h:1589:41)>
                ::anon_class_64_3_4ecd7a16::anon_class_32_2_ddb8d65b_for_write_digits::operator()
                          ((anon_class_32_2_ddb8d65b_for_write_digits *)&local_348,
                           bStack_2a0.container);
        local_280 = (buffer<char16_t> *)
                    base_iterator<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>>
                              (bVar3,bVar7);
      }
      else {
        write_int_data<char16_t>::write_int_data
                  ((write_int_data<char16_t> *)local_2d8,iVar4,local_37c,
                   (basic_format_specs<char16_t> *)abs_value._8_8_);
        local_2e0 = local_288.container;
        local_328._0_4_ = uVar1;
        local_328._8_8_ = local_2d8;
        local_328._16_8_ = data.size;
        local_328._32_8_ = local_348;
        local_300 = local_340;
        local_2f8 = local_338;
        local_280 = (buffer<char16_t> *)
                    write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,char16_t,fmt::v8::detail::write_int<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,char16_t,fmt::v8::detail::write_int<char16_t,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,unsigned__int128>(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,fmt::v8::detail::write_int_arg<unsigned__int128>,fmt::v8::basic_format_specs<char16_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>)_1_>(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,int,unsigned_int,fmt::v8::basic_format_specs<char16_t>const&,fmt::v8::detail::write_int<char16_t,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,unsigned__int128>(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,fmt::v8::detail::write_int_arg<unsigned__int128>,fmt::v8::basic_format_specs<char16_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>)_1_)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>)_1_>
                              (local_288,it.container,(size_t)local_2d8,
                               (anon_class_64_3_4ecd7a16 *)local_328);
      }
      local_350 = local_280;
    }
    else {
      local_350 = local_358;
    }
    break;
  case oct:
    n_02[0xc] = in_stack_fffffffffffffa94;
    n_02._0_12_ = in_stack_fffffffffffffa88;
    n_02[0xd] = in_stack_fffffffffffffa95;
    n_02[0xe] = in_stack_fffffffffffffa96;
    n_02[0xf] = in_stack_fffffffffffffa97;
    iVar4 = count_digits<3,unsigned__int128>((detail *)arg.abs_value,(unsigned___int128)n_02);
    if ((((*(ushort *)((long)&(abs_value._8_8_)->ptr_ + 1) >> 7 & 1) != 0) &&
        (*(int *)((long)&(abs_value._8_8_)->_vptr_buffer + 4) <= iVar4)) &&
       (_cStack_378 != (detail *)0x0 || (long)abs_value != 0)) {
      prefix_append(&local_37c,0x30);
    }
    uVar1 = local_37c;
    local_d8 = _cStack_378;
    local_d0 = (long)abs_value;
    unique0x10000617 = uStack_4c4;
    local_c8 = iVar4;
    local_18.container = local_358;
    it_3.container = abs_value._8_8_;
    if (*(int *)&(abs_value._8_8_)->_vptr_buffer == 0 &&
        *(int *)((long)&(abs_value._8_8_)->_vptr_buffer + 4) == -1) {
      tVar5 = to_unsigned<int>(iVar4);
      pbVar6 = reserve<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>>
                         (&local_18,(ulong)(tVar5 + (uVar1 >> 0x18)));
      bStack_30.container = pbVar6->container;
      if (uVar1 != 0) {
        for (local_34 = uVar1 & 0xffffff; local_34 != 0; local_34 = local_34 >> 8) {
          local_36 = (ushort)local_34 & 0xff;
          local_40 = std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>::operator++
                               (&stack0xffffffffffffffd0,0);
          pbVar6 = std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>::operator*
                             (&local_40);
          std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>::operator=(pbVar6,&local_36)
          ;
        }
      }
      bVar3.container = local_18.container;
      data_3.padding = (size_t)bStack_30.container;
      bVar7 = write_int<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>,_char16_t,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/format.h:1622:22)>
              ::anon_class_64_3_4ecd7a16::anon_class_32_2_ddb8d65b_for_write_digits::operator()
                        ((anon_class_32_2_ddb8d65b_for_write_digits *)&local_d8,bStack_30.container)
      ;
      local_10 = (buffer<char16_t> *)
                 base_iterator<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>>
                           (bVar3,bVar7);
    }
    else {
      write_int_data<char16_t>::write_int_data
                ((write_int_data<char16_t> *)local_68,iVar4,local_37c,
                 (basic_format_specs<char16_t> *)abs_value._8_8_);
      local_70 = local_18.container;
      local_b8._0_4_ = uVar1;
      local_b8._8_8_ = local_68;
      local_b8._16_8_ = data_3.size;
      local_b8._32_8_ = local_d8;
      local_90 = local_d0;
      local_88 = local_c8;
      local_10 = (buffer<char16_t> *)
                 write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,char16_t,fmt::v8::detail::write_int<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,char16_t,fmt::v8::detail::write_int<char16_t,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,unsigned__int128>(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,fmt::v8::detail::write_int_arg<unsigned__int128>,fmt::v8::basic_format_specs<char16_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>)_4_>(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,int,unsigned_int,fmt::v8::basic_format_specs<char16_t>const&,fmt::v8::detail::write_int<char16_t,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,unsigned__int128>(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,fmt::v8::detail::write_int_arg<unsigned__int128>,fmt::v8::basic_format_specs<char16_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>)_4_)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>)_1_>
                           (local_18,it_3.container,(size_t)local_68,
                            (anon_class_64_3_4ecd7a16 *)local_b8);
    }
    local_350 = local_10;
    break;
  case hex_lower:
  case hex_upper:
    bVar8 = specs->type == hex_upper;
    if ((*(ushort *)&specs->field_0x9 >> 7 & 1) != 0) {
      in_stack_fffffffffffffa96 = 0x78;
      in_stack_fffffffffffffa97 = 'X';
      if (!bVar8) {
        in_stack_fffffffffffffa97 = 'x';
      }
      prefix_append(&local_37c,(int)in_stack_fffffffffffffa97 << 8 | 0x30);
    }
    n_00[0xc] = in_stack_fffffffffffffa94;
    n_00._0_12_ = in_stack_fffffffffffffa88;
    n_00[0xd] = in_stack_fffffffffffffa95;
    n_00[0xe] = in_stack_fffffffffffffa96;
    n_00[0xf] = in_stack_fffffffffffffa97;
    iVar4 = count_digits<4,unsigned__int128>(_cStack_378,(unsigned___int128)n_00);
    uVar1 = local_37c;
    uStack_424 = CONCAT31(uStack_424._1_3_,bVar8);
    local_278 = _cStack_378;
    local_270 = (long)abs_value;
    unique0x10000627 = uStack_424;
    local_268 = iVar4;
    local_1b8.container = local_358;
    it_1.container = abs_value._8_8_;
    if (*(int *)&(abs_value._8_8_)->_vptr_buffer == 0 &&
        *(int *)((long)&(abs_value._8_8_)->_vptr_buffer + 4) == -1) {
      tVar5 = to_unsigned<int>(iVar4);
      pbVar6 = reserve<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>>
                         (&local_1b8,(ulong)(tVar5 + (uVar1 >> 0x18)));
      bStack_1d0.container = pbVar6->container;
      if (uVar1 != 0) {
        for (local_1d4 = uVar1 & 0xffffff; local_1d4 != 0; local_1d4 = local_1d4 >> 8) {
          local_1d6 = (ushort)local_1d4 & 0xff;
          local_1e0 = std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>::operator++
                                (&stack0xfffffffffffffe30,0);
          pbVar6 = std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>::operator*
                             (&local_1e0);
          std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>::operator=
                    (pbVar6,&local_1d6);
        }
      }
      bVar3.container = local_1b8.container;
      data_1.padding = (size_t)bStack_1d0.container;
      bVar7 = write_int<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>,_char16_t,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/format.h:1600:41)>
              ::anon_class_64_3_4ecd7a16::anon_class_32_3_bd9b568b_for_write_digits::operator()
                        ((anon_class_32_3_bd9b568b_for_write_digits *)&local_278,
                         bStack_1d0.container);
      local_1b0 = (buffer<char16_t> *)
                  base_iterator<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>>
                            (bVar3,bVar7);
    }
    else {
      write_int_data<char16_t>::write_int_data
                ((write_int_data<char16_t> *)local_208,iVar4,local_37c,
                 (basic_format_specs<char16_t> *)abs_value._8_8_);
      local_210 = local_1b8.container;
      local_258._0_4_ = uVar1;
      local_258._8_8_ = local_208;
      local_258._16_8_ = data_1.size;
      local_258._32_8_ = local_278;
      local_230 = local_270;
      local_228 = local_268;
      local_224 = bStack_264;
      local_1b0 = (buffer<char16_t> *)
                  write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,char16_t,fmt::v8::detail::write_int<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,char16_t,fmt::v8::detail::write_int<char16_t,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,unsigned__int128>(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,fmt::v8::detail::write_int_arg<unsigned__int128>,fmt::v8::basic_format_specs<char16_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>)_2_>(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,int,unsigned_int,fmt::v8::basic_format_specs<char16_t>const&,fmt::v8::detail::write_int<char16_t,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,unsigned__int128>(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,fmt::v8::detail::write_int_arg<unsigned__int128>,fmt::v8::basic_format_specs<char16_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>)_2_)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>)_1_>
                            (local_1b8,it_1.container,(size_t)local_208,
                             (anon_class_64_3_4ecd7a16 *)local_258);
    }
    local_350 = local_1b0;
    break;
  case bin_lower:
  case bin_upper:
    if ((*(ushort *)&specs->field_0x9 >> 7 & 1) != 0) {
      in_stack_fffffffffffffa94 = 0x62;
      in_stack_fffffffffffffa95 = 'B';
      if (specs->type != bin_upper) {
        in_stack_fffffffffffffa95 = 'b';
      }
      prefix_append(&local_37c,(int)in_stack_fffffffffffffa95 << 8 | 0x30);
    }
    n_01[0xc] = in_stack_fffffffffffffa94;
    n_01._0_12_ = in_stack_fffffffffffffa88;
    n_01[0xd] = in_stack_fffffffffffffa95;
    n_01[0xe] = in_stack_fffffffffffffa96;
    n_01[0xf] = in_stack_fffffffffffffa97;
    iVar4 = count_digits<1,unsigned__int128>(_cStack_378,(unsigned___int128)n_01);
    uVar1 = local_37c;
    local_1a8 = _cStack_378;
    local_1a0 = (long)abs_value;
    unique0x1000061f = uStack_474;
    local_198 = iVar4;
    local_e8.container = local_358;
    it_2.container = abs_value._8_8_;
    if (*(int *)&(abs_value._8_8_)->_vptr_buffer == 0 &&
        *(int *)((long)&(abs_value._8_8_)->_vptr_buffer + 4) == -1) {
      tVar5 = to_unsigned<int>(iVar4);
      pbVar6 = reserve<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>>
                         (&local_e8,(ulong)(tVar5 + (uVar1 >> 0x18)));
      bStack_100.container = pbVar6->container;
      if (uVar1 != 0) {
        for (local_104 = uVar1 & 0xffffff; local_104 != 0; local_104 = local_104 >> 8) {
          local_106 = (ushort)local_104 & 0xff;
          local_110 = std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>::operator++
                                (&stack0xffffffffffffff00,0);
          pbVar6 = std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>::operator*
                             (&local_110);
          std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>::operator=
                    (pbVar6,&local_106);
        }
      }
      bVar3.container = local_e8.container;
      data_2.padding = (size_t)bStack_100.container;
      bVar7 = write_int<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>,_char16_t,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/format.h:1611:22)>
              ::anon_class_64_3_4ecd7a16::anon_class_32_2_ddb8d65b_for_write_digits::operator()
                        ((anon_class_32_2_ddb8d65b_for_write_digits *)&local_1a8,
                         bStack_100.container);
      local_e0 = (buffer<char16_t> *)
                 base_iterator<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>>
                           (bVar3,bVar7);
    }
    else {
      write_int_data<char16_t>::write_int_data
                ((write_int_data<char16_t> *)local_138,iVar4,local_37c,
                 (basic_format_specs<char16_t> *)abs_value._8_8_);
      local_140 = local_e8.container;
      local_188._0_4_ = uVar1;
      local_188._8_8_ = local_138;
      local_188._16_8_ = data_2.size;
      local_188._32_8_ = local_1a8;
      local_160 = local_1a0;
      local_158 = local_198;
      local_e0 = (buffer<char16_t> *)
                 write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,char16_t,fmt::v8::detail::write_int<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,char16_t,fmt::v8::detail::write_int<char16_t,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,unsigned__int128>(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,fmt::v8::detail::write_int_arg<unsigned__int128>,fmt::v8::basic_format_specs<char16_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>)_3_>(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,int,unsigned_int,fmt::v8::basic_format_specs<char16_t>const&,fmt::v8::detail::write_int<char16_t,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,unsigned__int128>(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,fmt::v8::detail::write_int_arg<unsigned__int128>,fmt::v8::basic_format_specs<char16_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>)_3_)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>)_1_>
                           (local_e8,it_2.container,(size_t)local_138,
                            (anon_class_64_3_4ecd7a16 *)local_188);
    }
    local_350 = local_e0;
    break;
  default:
    fmt::v8::detail::throw_format_error("invalid type specifier");
    break;
  case chr:
    cStack_378 = (char16_t)arg.abs_value;
    value_00 = cStack_378;
    _cStack_378 = pdVar2;
    local_350 = (buffer<char16_t> *)
                write_char<char16_t,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>>
                          (out,value_00,specs);
  }
  return (back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>)local_350;
}

Assistant:

FMT_CONSTEXPR FMT_NOINLINE auto write_int_noinline(
    OutputIt out, write_int_arg<T> arg, const basic_format_specs<Char>& specs,
    locale_ref loc) -> OutputIt {
  return write_int(out, arg, specs, loc);
}